

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O3

void __thiscall
BackwardPass::InsertTypeTransition
          (BackwardPass *this,Instr *instrInsertBefore,StackSym *objSym,AddPropertyCacheBucket *data
          ,BVSparse<Memory::JitArenaAllocator> *upwardExposedUses)

{
  Type pJVar1;
  StackSym *this_00;
  code *pcVar2;
  bool bVar3;
  BOOLEAN BVar4;
  undefined4 *puVar5;
  RegOpnd *this_01;
  JITType *pJVar6;
  intptr_t iVar7;
  AddrOpnd *src2Opnd;
  AddrOpnd *dstOpnd;
  Instr *instr;
  JITTypeHandler *oldTypeHandler;
  JITTypeHandler *newTypeHandler;
  ObjectSymInfo *pOVar8;
  int local_6c;
  JITTypeHolderBase<void> JStack_68;
  int newCount;
  JITTypeHolder initialType;
  int oldCount;
  JITTypeHolderBase<void> local_40;
  JITTypeHolder finalType;
  PropertyIndex inlineSlotCapacity;
  PropertyIndex newInlineSlotCapacity;
  
  if (this->currentPrePassLoop != (Loop *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x1742,"(!this->IsPrePass())","!this->IsPrePass()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  this_01 = IR::RegOpnd::New(objSym,TyInt64,this->func);
  IR::Opnd::SetIsJITOptimizedReg(&this_01->super_Opnd,true);
  pJVar1 = (data->initialType).t;
  JStack_68.t = pJVar1;
  local_40.t = pJVar1;
  pJVar6 = JITTypeHolderBase<void>::operator->(&local_40);
  iVar7 = JITType::GetAddr(pJVar6);
  src2Opnd = IR::AddrOpnd::New(iVar7,AddrOpndKindDynamicType,this->func,false,(Var)0x0);
  src2Opnd->m_metadata = pJVar1;
  pJVar1 = (data->finalType).t;
  initialType.t = pJVar1;
  local_40.t = pJVar1;
  pJVar6 = JITTypeHolderBase<void>::operator->(&initialType);
  iVar7 = JITType::GetAddr(pJVar6);
  dstOpnd = IR::AddrOpnd::New(iVar7,AddrOpndKindDynamicType,this->func,false,(Var)0x0);
  dstOpnd->m_metadata = pJVar1;
  instr = IR::Instr::New(AdjustObjType,&dstOpnd->super_Opnd,&this_01->super_Opnd,
                         &src2Opnd->super_Opnd,this->func);
  if (upwardExposedUses != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    pJVar6 = JITTypeHolderBase<void>::operator->(&stack0xffffffffffffff98);
    oldTypeHandler = JITType::GetTypeHandler(pJVar6);
    pJVar6 = JITTypeHolderBase<void>::operator->(&local_40);
    newTypeHandler = JITType::GetTypeHandler(pJVar6);
    bVar3 = JITTypeHandler::NeedSlotAdjustment
                      (oldTypeHandler,newTypeHandler,(int *)&initialType,&local_6c,
                       (PropertyIndex *)((long)&finalType.t + 4),
                       (PropertyIndex *)((long)&finalType.t + 6));
    if (bVar3) {
      this_00 = this_01->m_sym;
      bVar3 = StackSym::HasObjectInfo(this_00);
      if (bVar3) {
        pOVar8 = StackSym::GetObjectInfo(this_00);
        if (pOVar8->m_auxSlotPtrSym != (StackSym *)0x0) {
          BVar4 = BVSparse<Memory::JitArenaAllocator>::Test
                            (upwardExposedUses,(pOVar8->m_auxSlotPtrSym->super_Sym).m_id);
          if (BVar4 != '\0') {
            instr->m_opcode = AdjustObjTypeReloadAuxSlotPtr;
          }
        }
      }
    }
  }
  IR::Instr::InsertBefore(instrInsertBefore,instr);
  return;
}

Assistant:

void
BackwardPass::InsertTypeTransition(IR::Instr *instrInsertBefore, StackSym *objSym, AddPropertyCacheBucket *data, BVSparse<JitArenaAllocator>* upwardExposedUses)
{
    Assert(!this->IsPrePass());

    IR::RegOpnd *baseOpnd = IR::RegOpnd::New(objSym, TyMachReg, this->func);
    baseOpnd->SetIsJITOptimizedReg(true);

    JITTypeHolder initialType = data->GetInitialType();
    IR::AddrOpnd *initialTypeOpnd =
        IR::AddrOpnd::New(data->GetInitialType()->GetAddr(), IR::AddrOpndKindDynamicType, this->func);
    initialTypeOpnd->m_metadata = initialType.t;

    JITTypeHolder finalType = data->GetFinalType();
    IR::AddrOpnd *finalTypeOpnd =
        IR::AddrOpnd::New(data->GetFinalType()->GetAddr(), IR::AddrOpndKindDynamicType, this->func);
    finalTypeOpnd->m_metadata = finalType.t;

    IR::Instr *adjustTypeInstr =
        IR::Instr::New(Js::OpCode::AdjustObjType, finalTypeOpnd, baseOpnd, initialTypeOpnd, this->func);

    if (upwardExposedUses)
    {
        // If this type change causes a slot adjustment, the aux slot pointer (if any) will be reloaded here, so take it out of upwardExposedUses.
        int oldCount;
        int newCount;
        Js::PropertyIndex inlineSlotCapacity;
        Js::PropertyIndex newInlineSlotCapacity;
        bool needSlotAdjustment =
            JITTypeHandler::NeedSlotAdjustment(initialType->GetTypeHandler(), finalType->GetTypeHandler(), &oldCount, &newCount, &inlineSlotCapacity, &newInlineSlotCapacity);
        if (needSlotAdjustment)
        {
            StackSym *auxSlotPtrSym = baseOpnd->m_sym->GetAuxSlotPtrSym();
            if (auxSlotPtrSym)
            {
                if (upwardExposedUses->Test(auxSlotPtrSym->m_id))
                {
                    adjustTypeInstr->m_opcode = Js::OpCode::AdjustObjTypeReloadAuxSlotPtr;
                }
            }
        }
    }

    instrInsertBefore->InsertBefore(adjustTypeInstr);
}